

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file)

{
  ROMInfo **romInfos;
  ROMInfo *pRVar1;
  File *file_local;
  
  romInfos = getKnownROMInfoList();
  pRVar1 = getROMInfo(file,romInfos);
  return pRVar1;
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file) {
	return getROMInfo(file, getKnownROMInfoList());
}